

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O1

unique_ptr<Reflection::Struct,_std::default_delete<Reflection::Struct>_> __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)5>
::get_options(ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)5>
              *this)

{
  Display DVar1;
  Options *this_00;
  Display DVar2;
  long in_RSI;
  
  this_00 = (Options *)operator_new(0x10);
  Oric::Machine::Options::Options(this_00,UserFriendly);
  DVar1 = (**(code **)(*(long *)(in_RSI + 0x20) + 0x20))(in_RSI + 0x20);
  DVar2 = RGB;
  if (DVar1 - SVideo < 3) {
    DVar2 = DVar1;
  }
  (this_00->super_DisplayOption<Oric::Machine::Options>).output = DVar2;
  (this_00->super_QuickloadOption<Oric::Machine::Options>).quickload = *(bool *)(in_RSI + 0x11d58);
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)this_00;
  return (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         (__uniq_ptr_data<Reflection::Struct,_std::default_delete<Reflection::Struct>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Reflection::Struct> get_options() final {
			auto options = std::make_unique<Options>(Configurable::OptionsType::UserFriendly);
			options->output = get_video_signal_configurable();
			options->quickload = use_fast_tape_hack_;
			return options;
		}